

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowStackToolWindow(bool *p_open)

{
  bool bVar1;
  ImU32 color;
  ImGuiWindow *pIVar2;
  ImGuiStackLevelInfo *pIVar3;
  ImGuiStackLevelInfo *pIVar4;
  ImVec2 IVar5;
  ImGuiWindow *local_60;
  uint local_58;
  bool local_51;
  ImGuiWindow *window;
  ImGuiStackLevelInfo *info;
  int n;
  float id_width;
  ImGuiStackTool *local_28;
  ImGuiStackTool *tool;
  ImGuiID active_id;
  ImGuiID hovered_id;
  ImGuiContext *g;
  bool *p_open_local;
  
  g = (ImGuiContext *)p_open;
  bVar1 = Begin("Dear ImGui Stack Tool",p_open,0);
  if ((bVar1) && (pIVar2 = GetCurrentWindow(), pIVar2->BeginCount < 2)) {
    _active_id = GImGui;
    tool._4_4_ = GImGui->HoveredIdPreviousFrame;
    tool._0_4_ = GImGui->ActiveId;
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)tool._4_4_,(ulong)(uint)tool);
    SameLine(0.0,-1.0);
    MetricsHelpMarker(
                     "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                     );
    local_28 = &_active_id->DebugStackTool;
    local_28->LastActiveFrame = _active_id->FrameCount;
    local_51 = false;
    if (0 < (_active_id->DebugStackTool).Results.Size) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffd0,0.0,0.0);
      local_51 = BeginTable("##table",3,0x780,(ImVec2 *)&stack0xffffffffffffffd0,0.0);
    }
    if (local_51 != false) {
      IVar5 = CalcTextSize("0xDDDDDDDD",(char *)0x0,false,-1.0);
      info._4_4_ = IVar5.x;
      TableSetupColumn("Seed",0x10,info._4_4_,0);
      TableSetupColumn("PushID",8,0.0,0);
      TableSetupColumn("Result",0x10,info._4_4_,0);
      TableHeadersRow();
      for (info._0_4_ = 0; (int)info < (local_28->Results).Size; info._0_4_ = (int)info + 1) {
        pIVar3 = ImVector<ImGuiStackLevelInfo>::operator[](&local_28->Results,(int)info);
        TableNextColumn();
        if ((int)info < 1) {
          local_58 = 0;
        }
        else {
          pIVar4 = ImVector<ImGuiStackLevelInfo>::operator[](&local_28->Results,(int)info + -1);
          local_58 = pIVar4->ID;
        }
        Text("0x%08X",(ulong)local_58);
        TableNextColumn();
        if ((pIVar3->Desc[0] == '\0') && ((int)info == 0)) {
          local_60 = FindWindowByID(pIVar3->ID);
        }
        else {
          local_60 = (ImGuiWindow *)0x0;
        }
        if (local_60 == (ImGuiWindow *)0x0) {
          if ((pIVar3->QuerySuccess & 1U) == 0) {
            if ((local_28->Results).Size <= local_28->StackLevel) {
              TextUnformatted("???",(char *)0x0);
            }
          }
          else {
            TextUnformatted(pIVar3->Desc,(char *)0x0);
          }
        }
        else {
          Text("\"%s\" [window]",local_60->Name);
        }
        TableNextColumn();
        Text("0x%08X",(ulong)pIVar3->ID);
        if ((int)info == (local_28->Results).Size + -1) {
          color = GetColorU32(0x18,1.0);
          TableSetBgColor(3,color,-1);
        }
      }
      EndTable();
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiContext& g = *GImGui;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // Display decorated stack
    ImGuiStackTool* tool = &g.DebugStackTool;
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);

            TableNextColumn();
            ImGuiWindow* window = (info->Desc[0] == 0 && n == 0) ? FindWindowByID(info->ID) : NULL;
            if (window)                                         // Source: window name (because the root ID don't call GetID() and so doesn't get hooked)
                Text("\"%s\" [window]", window->Name);
            else if (info->QuerySuccess)                        // Source: GetID() hooks (prioritize over ItemInfo() because we frequently use patterns like: PushID(str), Button("") where they both have same id)
                TextUnformatted(info->Desc);
            else if (tool->StackLevel >= tool->Results.Size)    // Only start using fallback below when all queries are done, so during queries we don't flickering ??? markers.
            {
#ifdef IMGUI_ENABLE_TEST_ENGINE
                if (const char* label = ImGuiTestEngine_FindItemDebugLabel(&g, info->ID))    // Source: ImGuiTestEngine's ItemInfo()
                    Text("??? \"%s\"", label);
                else
#endif
                    TextUnformatted("???");
            }

            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}